

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

uint32 rw::xbox::getSizeNativeTexture(Texture *tex)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = Raster::getNumLevels(tex->raster);
  uVar5 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar5;
  }
  iVar4 = 0x68;
  for (; uVar3 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
    iVar4 = iVar4 + *(int *)(*(long *)((long)&tex->raster->platform + (long)nativeRasterOffset) +
                             0x10 + uVar5);
  }
  uVar1 = tex->raster->format;
  uVar2 = 0x80;
  if ((uVar1 >> 0xe & 1) == 0) {
    uVar2 = uVar1 >> 3 & 0x400;
  }
  return uVar2 + (iVar4 + 3U & 0xfffffffc);
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 16 + 4;
	int32 levels = tex->raster->getNumLevels();
	for(int32 i = 0; i < levels; i++)
		size += getLevelSize(tex->raster, i);
	size = (size+3)&~3;
	if(tex->raster->format & Raster::PAL4)
		size += 4*32;
	else if(tex->raster->format & Raster::PAL8)
		size += 4*256;
	return size;
}